

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

void __thiscall
duckdb::BitpackingState<duckdb::uhugeint_t,_duckdb::hugeint_t>::Reset
          (BitpackingState<duckdb::uhugeint_t,_duckdb::hugeint_t> *this)

{
  long in_RDI;
  int64_t in_stack_ffffffffffffff88;
  hugeint_t *in_stack_ffffffffffffff90;
  uhugeint_t local_68;
  undefined8 local_58;
  undefined8 local_50;
  hugeint_t local_48;
  uhugeint_t local_38;
  hugeint_t local_28;
  uhugeint_t local_18;
  
  local_18 = NumericLimits<duckdb::uhugeint_t>::Maximum();
  *(uint64_t *)(in_RDI + 0x10830) = local_18.lower;
  *(uint64_t *)(in_RDI + 0x10838) = local_18.upper;
  local_28 = NumericLimits<duckdb::hugeint_t>::Maximum();
  *(uint64_t *)(in_RDI + 0x10860) = local_28.lower;
  *(int64_t *)(in_RDI + 0x10868) = local_28.upper;
  local_38 = NumericLimits<duckdb::uhugeint_t>::Minimum();
  *(uint64_t *)(in_RDI + 0x10840) = local_38.lower;
  *(uint64_t *)(in_RDI + 0x10848) = local_38.upper;
  local_48 = NumericLimits<duckdb::hugeint_t>::Minimum();
  *(uint64_t *)(in_RDI + 0x10870) = local_48.lower;
  *(int64_t *)(in_RDI + 0x10878) = local_48.upper;
  hugeint_t::hugeint_t(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  *(undefined8 *)(in_RDI + 0x10890) = local_58;
  *(undefined8 *)(in_RDI + 0x10898) = local_50;
  *(undefined1 *)(in_RDI + 0x108a0) = 1;
  *(undefined1 *)(in_RDI + 0x108a1) = 1;
  *(undefined1 *)(in_RDI + 0x108a2) = 0;
  *(undefined1 *)(in_RDI + 0x108a3) = 0;
  *(undefined8 *)(in_RDI + 0x10818) = 0;
  uhugeint_t::uhugeint_t(&local_68,0);
  *(uint64_t *)(in_RDI + 0x10850) = local_68.lower;
  *(uint64_t *)(in_RDI + 0x10858) = local_68.upper;
  hugeint_t::hugeint_t(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  *(int64_t *)(in_RDI + 0x10880) = in_stack_ffffffffffffff88;
  *(hugeint_t **)(in_RDI + 0x10888) = in_stack_ffffffffffffff90;
  return;
}

Assistant:

void Reset() {
		minimum = NumericLimits<T>::Maximum();
		minimum_delta = NumericLimits<T_S>::Maximum();
		maximum = NumericLimits<T>::Minimum();
		maximum_delta = NumericLimits<T_S>::Minimum();
		delta_offset = 0;
		all_valid = true;
		all_invalid = true;
		can_do_delta = false;
		can_do_for = false;
		compression_buffer_idx = 0;
		min_max_diff = 0;
		min_max_delta_diff = 0;
	}